

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkmanagerservice.cpp
# Opt level: O2

NMConnectivityState __thiscall
QNetworkManagerInterface::connectivityState(QNetworkManagerInterface *this)

{
  NMConnectivityState NVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  
  anon_unknown.dwarf_381fd::connectivityKey();
  cVar2 = QMap<QString,_QVariant>::find
                    ((QMap<QString,_QVariant> *)(this + 0x10),
                     &anon_unknown.dwarf_381fd::connectivityKey::key);
  cVar3._M_node = *(_Base_ptr *)(this + 0x10);
  if (cVar3._M_node != (_Base_ptr)0x0) {
    cVar3._M_node = (_Base_ptr)&(cVar3._M_node)->_M_left;
  }
  if (cVar2.i._M_node != (const_iterator)cVar3._M_node) {
    NVar1 = QVariant::toUInt((bool *)((long)cVar2.i._M_node + 0x38));
    return NVar1;
  }
  return NM_CONNECTIVITY_UNKNOWN;
}

Assistant:

QNetworkManagerInterface::NMConnectivityState QNetworkManagerInterface::connectivityState() const
{
    auto it = propertyMap.constFind(connectivityKey());
    if (it != propertyMap.cend())
        return static_cast<NMConnectivityState>(it->toUInt());
    return QNetworkManagerInterface::NM_CONNECTIVITY_UNKNOWN;
}